

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interp.cc
# Opt level: O0

Result RunSpecificExports(Ptr *instance,Errors *errors,
                         vector<FunctionCall,_std::allocator<FunctionCall>_> *calls)

{
  Stream *this;
  Index this_00;
  bool bVar1;
  __type _Var2;
  Result rhs;
  Instance *pIVar3;
  Ref ref;
  Module *this_01;
  ModuleDesc *pMVar4;
  reference __lhs;
  reference __rhs;
  pointer pEVar5;
  undefined8 uVar6;
  FuncType *pFVar7;
  size_type sVar8;
  RefVec *this_02;
  const_reference pvVar9;
  Func *this_03;
  pointer this_04;
  string_view name;
  undefined1 auVar10 [16];
  Ptr *in_stack_fffffffffffffee0;
  undefined1 local_f0 [8];
  Ptr trap;
  Values results;
  undefined1 local_b8 [8];
  RefPtr<wabt::interp::Func> func;
  int args_size;
  int params_size;
  FuncType *func_type;
  FunctionCall *call_;
  iterator __end2;
  iterator __begin2;
  vector<FunctionCall,_std::allocator<FunctionCall>_> *__range2;
  ExportDesc *export_;
  const_iterator __end1;
  const_iterator __begin1;
  vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_> *__range1;
  ModuleDesc *module_desc;
  undefined1 local_40 [8];
  RefPtr<wabt::interp::Module> module;
  vector<FunctionCall,_std::allocator<FunctionCall>_> *calls_local;
  Errors *errors_local;
  Ptr *instance_local;
  Result result;
  
  module.root_index_ = (Index)calls;
  wabt::Result::Result((Result *)((long)&instance_local + 4),Ok);
  pIVar3 = wabt::interp::RefPtr<wabt::interp::Instance>::operator->(instance);
  ref = wabt::interp::Instance::module(pIVar3);
  wabt::interp::Store::UnsafeGet<wabt::interp::Module>
            ((RefPtr<wabt::interp::Module> *)local_40,&s_store,ref);
  this_01 = wabt::interp::RefPtr<wabt::interp::Module>::operator->
                      ((RefPtr<wabt::interp::Module> *)local_40);
  pMVar4 = wabt::interp::Module::desc(this_01);
  __end1 = std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::begin
                     (&pMVar4->exports);
  export_ = (ExportDesc *)
            std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::end
                      (&pMVar4->exports);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_wabt::interp::ExportDesc_*,_std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>_>
                                *)&export_);
    if (!bVar1) {
      wabt::interp::RefPtr<wabt::interp::Module>::~RefPtr((RefPtr<wabt::interp::Module> *)local_40);
      return (Result)instance_local._4_4_;
    }
    __lhs = __gnu_cxx::
            __normal_iterator<const_wabt::interp::ExportDesc_*,_std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>_>
            ::operator*(&__end1);
    this_00 = module.root_index_;
    __end2 = std::vector<FunctionCall,_std::allocator<FunctionCall>_>::begin
                       ((vector<FunctionCall,_std::allocator<FunctionCall>_> *)module.root_index_);
    call_ = (FunctionCall *)
            std::vector<FunctionCall,_std::allocator<FunctionCall>_>::end
                      ((vector<FunctionCall,_std::allocator<FunctionCall>_> *)this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<FunctionCall_*,_std::vector<FunctionCall,_std::allocator<FunctionCall>_>_>
                                       *)&call_), bVar1) {
      __rhs = __gnu_cxx::
              __normal_iterator<FunctionCall_*,_std::vector<FunctionCall,_std::allocator<FunctionCall>_>_>
              ::operator*(&__end2);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,&__rhs->name);
      if (_Var2) {
        pEVar5 = std::
                 unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                 ::operator->(&(__lhs->type).type);
        this = s_trace_stream;
        if (pEVar5->kind != First) {
          uVar6 = std::__cxx11::string::c_str();
          printf("Export \'%s\' is not a function\n",uVar6);
          exit(1);
        }
        if (s_trace_stream != (Stream *)0x0) {
          uVar6 = std::__cxx11::string::c_str();
          wabt::Stream::Writef(this,">>> running export \"%s\":\n",uVar6);
        }
        pEVar5 = std::
                 unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
                 ::get(&(__lhs->type).type);
        pFVar7 = wabt::cast<wabt::interp::FuncType,wabt::interp::ExternType>(pEVar5);
        sVar8 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(&pFVar7->params);
        func.root_index_._4_4_ = (uint)sVar8;
        sVar8 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::size
                          (&__rhs->args);
        func.root_index_._0_4_ = (uint)sVar8;
        if (func.root_index_._4_4_ != (uint)func.root_index_) {
          uVar6 = std::__cxx11::string::c_str();
          printf("Exported function \'%s\' expects %d arguments, but %d were provided\n",uVar6,
                 (ulong)func.root_index_._4_4_,(ulong)(uint)func.root_index_);
          exit(1);
        }
        pIVar3 = wabt::interp::RefPtr<wabt::interp::Instance>::operator->(instance);
        this_02 = wabt::interp::Instance::funcs(pIVar3);
        pvVar9 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                           (this_02,(ulong)__lhs->index);
        wabt::interp::Store::UnsafeGet<wabt::interp::Func>
                  ((RefPtr<wabt::interp::Func> *)local_b8,&s_store,(Ref)pvVar9->index);
        std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
                  ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)
                   &trap.root_index_);
        wabt::interp::RefPtr<wabt::interp::Trap>::RefPtr((RefPtr<wabt::interp::Trap> *)local_f0);
        this_03 = wabt::interp::RefPtr<wabt::interp::Func>::operator->
                            ((RefPtr<wabt::interp::Func> *)local_b8);
        rhs = wabt::interp::Func::Call
                        (this_03,&s_store,&__rhs->args,(Values *)&trap.root_index_,(Ptr *)local_f0,
                         s_trace_stream);
        wabt::Result::operator|=((Result *)((long)&instance_local + 4),rhs);
        this_04 = std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::get
                            (&s_stdout_stream);
        auVar10 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)__lhs);
        name._M_len = auVar10._8_8_;
        name._M_str = (char *)pFVar7;
        wabt::interp::WriteCall
                  ((interp *)this_04,auVar10._0_8_,name,(FuncType *)&__rhs->args,
                   (Values *)&trap.root_index_,(Values *)local_f0,in_stack_fffffffffffffee0);
        wabt::interp::RefPtr<wabt::interp::Trap>::~RefPtr((RefPtr<wabt::interp::Trap> *)local_f0);
        std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector
                  ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)
                   &trap.root_index_);
        wabt::interp::RefPtr<wabt::interp::Func>::~RefPtr((RefPtr<wabt::interp::Func> *)local_b8);
      }
      __gnu_cxx::
      __normal_iterator<FunctionCall_*,_std::vector<FunctionCall,_std::allocator<FunctionCall>_>_>::
      operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<const_wabt::interp::ExportDesc_*,_std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

Result RunSpecificExports(const Instance::Ptr& instance,
                          Errors* errors,
                          std::vector<FunctionCall>& calls) {
  Result result = Result::Ok;

  auto module = s_store.UnsafeGet<Module>(instance->module());
  auto&& module_desc = module->desc();

  for (auto&& export_ : module_desc.exports) {
    for (auto& call_ : calls) {
      if (export_.type.name == call_.name) {
        ERROR_EXIT_UNLESS(export_.type.type->kind == ExternalKind::Func,
                          "Export '%s' is not a function\n",
                          export_.type.name.c_str());

        if (s_trace_stream) {
          s_trace_stream->Writef(">>> running export \"%s\":\n",
                                 call_.name.c_str());
        }
        auto* func_type = cast<FuncType>(export_.type.type.get());
        int params_size = func_type->params.size();
        int args_size = call_.args.size();
        ERROR_EXIT_UNLESS(params_size == args_size,
                          "Exported function '%s' expects %d arguments, but %d "
                          "were provided\n",
                          export_.type.name.c_str(), params_size, args_size);

        auto func = s_store.UnsafeGet<Func>(instance->funcs()[export_.index]);
        Values results;
        Trap::Ptr trap;
        result |=
            func->Call(s_store, call_.args, results, &trap, s_trace_stream);
        WriteCall(s_stdout_stream.get(), export_.type.name, *func_type,
                  call_.args, results, trap);
      }
    }
  }

  return result;
}